

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::_swap_props(Tree *this,size_t n_,size_t m_)

{
  NodeData *__a;
  NodeData *__b;
  NodeScalar *in_RDI;
  NodeScalar *unaff_retaddr;
  NodeData *m;
  NodeData *n;
  
  __a = _p((Tree *)m_,(size_t)n);
  __b = _p((Tree *)m_,(size_t)n);
  std::swap<c4::yml::NodeType>(&__a->m_type,&__b->m_type);
  std::swap<c4::yml::NodeScalar>(unaff_retaddr,in_RDI);
  std::swap<c4::yml::NodeScalar>(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void Tree::_swap_props(size_t n_, size_t m_)
{
    NodeData &C4_RESTRICT n = *_p(n_);
    NodeData &C4_RESTRICT m = *_p(m_);
    std::swap(n.m_type, m.m_type);
    std::swap(n.m_key, m.m_key);
    std::swap(n.m_val, m.m_val);
}